

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t *
Gia_ManMiter(Gia_Man_t *p0,Gia_Man_t *p1,int nInsDup,int fDualOut,int fSeq,int fImplic,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  Gia_Man_t *p;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  
  if (fSeq == 0) {
    if (p0->vCis->nSize == p1->vCis->nSize) {
      if (p0->vCos->nSize == p1->vCos->nSize) {
LAB_001e9272:
        pGVar3 = Gia_ManStart(p1->nObjs + p0->nObjs);
        pcVar16 = (char *)malloc(6);
        builtin_strncpy(pcVar16,"miter",6);
        pGVar3->pName = pcVar16;
        Gia_ManFillValue(p0);
        Gia_ManFillValue(p1);
        p0->pObjs->Value = 0;
        p1->pObjs->Value = 0;
        Gia_ManHashAlloc(pGVar3);
        if (fSeq == 0) {
          pVVar5 = p0->vCis;
          if (0 < pVVar5->nSize) {
            lVar17 = 0;
            do {
              iVar11 = pVVar5->pArray[lVar17];
              if (((long)iVar11 < 0) || (p0->nObjs <= iVar11)) goto LAB_001ea1de;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar4 = Gia_ManAppendObj(pGVar3);
              uVar8 = *(ulong *)pGVar4;
              *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
              *(ulong *)pGVar4 =
                   uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              Vec_IntPush(pGVar3->vCis,
                          (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              pGVar1[iVar11].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
              lVar17 = lVar17 + 1;
              pVVar5 = p0->vCis;
            } while (lVar17 < pVVar5->nSize);
          }
          pVVar5 = p1->vCis;
          uVar8 = (ulong)(uint)pVVar5->nSize;
          if (0 < pVVar5->nSize) {
            lVar17 = 0;
            do {
              lVar14 = (long)pVVar5->pArray[lVar17];
              if ((lVar14 < 0) || (p1->nObjs <= pVVar5->pArray[lVar17])) goto LAB_001ea1de;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              if (lVar17 < (int)uVar8 - nInsDup) {
                if (pGVar3->vCis->nSize <= lVar17) goto LAB_001ea21c;
                iVar11 = pGVar3->vCis->pArray[lVar17];
                if (((long)iVar11 < 0) || (pGVar3->nObjs <= iVar11)) goto LAB_001ea1de;
                pGVar2 = pGVar3->pObjs;
                pGVar4 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar11) & 0xfffffffffffffffe);
                if ((pGVar4 < pGVar2) || (pGVar2 + (uint)pGVar3->nObjs <= pGVar4))
                goto LAB_001ea1fd;
                iVar10 = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2);
                if (iVar10 * -0x55555555 < 0) goto LAB_001ea279;
                pGVar1[lVar14].Value = ((uint)(pGVar2 + iVar11) & 1) + iVar10 * 0x55555556;
              }
              else {
                pGVar4 = Gia_ManAppendObj(pGVar3);
                uVar8 = *(ulong *)pGVar4;
                *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
                *(ulong *)pGVar4 =
                     uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = pGVar3->pObjs;
                if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
                Vec_IntPush(pGVar3->vCis,
                            (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
                pGVar2 = pGVar3->pObjs;
                if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
                pGVar1[lVar14].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556
                ;
                pVVar5 = p1->vCis;
              }
              lVar17 = lVar17 + 1;
              uVar8 = (ulong)pVVar5->nSize;
            } while (lVar17 < (long)uVar8);
          }
          pVVar5 = p0->vCos;
          if (0 < pVVar5->nSize) {
            lVar17 = 0;
            do {
              iVar11 = pVVar5->pArray[lVar17];
              if (((long)iVar11 < 0) || (p0->nObjs <= iVar11)) goto LAB_001ea1de;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar11;
              Gia_ManMiter_rec(pGVar3,p0,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff));
              if (p1->vCos->nSize <= lVar17) goto LAB_001ea21c;
              iVar11 = p1->vCos->pArray[lVar17];
              if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
              Gia_ManMiter_rec(pGVar3,p1,
                               p1->pObjs + iVar11 + -(*(ulong *)(p1->pObjs + iVar11) & 0x1fffffff));
              uVar8 = *(ulong *)pGVar1;
              uVar6 = pGVar1[-(uVar8 & 0x1fffffff)].Value;
              if (fDualOut == 0) {
                if (fImplic == 0) {
                  if ((int)uVar6 < 0) goto LAB_001ea23b;
                  if (p1->vCos->nSize <= lVar17) goto LAB_001ea21c;
                  iVar11 = p1->vCos->pArray[lVar17];
                  if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                  uVar7 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                  uVar13 = (p1->pObjs + iVar11)[-(ulong)(uVar7 & 0x1fffffff)].Value;
                  if ((int)uVar13 < 0) goto LAB_001ea23b;
                  uVar6 = Gia_ManHashXor(pGVar3,(uint)uVar8 >> 0x1d & 1 ^ uVar6,
                                         uVar7 >> 0x1d & 1 ^ uVar13);
                }
                else {
                  if ((int)uVar6 < 0) goto LAB_001ea23b;
                  lVar14 = (long)p1->vCos->nSize;
                  if (lVar14 - p1->nRegs <= lVar17) goto LAB_001ea25a;
                  if (lVar14 <= lVar17) goto LAB_001ea21c;
                  iVar11 = p1->vCos->pArray[lVar17];
                  if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                  uVar7 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                  uVar13 = (p1->pObjs + iVar11)[-(ulong)(uVar7 & 0x1fffffff)].Value;
                  if ((int)uVar13 < 0) goto LAB_001ea23b;
                  uVar6 = Gia_ManHashAnd(pGVar3,(uint)uVar8 >> 0x1d & 1 ^ uVar6,
                                         uVar13 ^ uVar7 >> 0x1d & 1 ^ 1);
                }
              }
              else {
                if ((int)uVar6 < 0) goto LAB_001ea23b;
                Gia_ManAppendCo(pGVar3,(uint)(uVar8 >> 0x1d) & 1 ^ uVar6);
                if (p1->vCos->nSize <= lVar17) goto LAB_001ea21c;
                iVar11 = p1->vCos->pArray[lVar17];
                if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                uVar13 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                uVar6 = (p1->pObjs + iVar11)[-(ulong)(uVar13 & 0x1fffffff)].Value;
                if ((int)uVar6 < 0) goto LAB_001ea23b;
                uVar6 = uVar13 >> 0x1d & 1 ^ uVar6;
              }
              Gia_ManAppendCo(pGVar3,uVar6);
              lVar17 = lVar17 + 1;
              pVVar5 = p0->vCos;
            } while (lVar17 < pVVar5->nSize);
          }
        }
        else {
          iVar11 = p0->nRegs;
          pVVar5 = p0->vCis;
          iVar10 = pVVar5->nSize;
          if (iVar11 < iVar10) {
            lVar17 = 0;
            do {
              if (iVar10 <= lVar17) goto LAB_001ea21c;
              iVar10 = pVVar5->pArray[lVar17];
              if (((long)iVar10 < 0) || (p0->nObjs <= iVar10)) goto LAB_001ea1de;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar4 = Gia_ManAppendObj(pGVar3);
              uVar8 = *(ulong *)pGVar4;
              *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
              *(ulong *)pGVar4 =
                   uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              Vec_IntPush(pGVar3->vCis,
                          (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              pGVar1[iVar10].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
              lVar17 = lVar17 + 1;
              iVar11 = p0->nRegs;
              pVVar5 = p0->vCis;
              iVar10 = pVVar5->nSize;
            } while (lVar17 < iVar10 - iVar11);
          }
          iVar10 = p1->nRegs;
          pVVar5 = p1->vCis;
          iVar12 = pVVar5->nSize;
          iVar9 = iVar12 - iVar10;
          if (iVar9 != 0 && iVar10 <= iVar12) {
            lVar17 = 0;
            do {
              if (iVar12 <= lVar17) goto LAB_001ea21c;
              lVar14 = (long)pVVar5->pArray[lVar17];
              if ((lVar14 < 0) || (p1->nObjs <= pVVar5->pArray[lVar17])) goto LAB_001ea1de;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              if (lVar17 < iVar9 - nInsDup) {
                lVar15 = (long)pGVar3->vCis->nSize;
                if (lVar15 - pGVar3->nRegs <= lVar17) {
                  __assert_fail("v < Gia_ManPiNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
                }
                if (lVar15 <= lVar17) goto LAB_001ea21c;
                iVar11 = pGVar3->vCis->pArray[lVar17];
                if (((long)iVar11 < 0) || (pGVar3->nObjs <= iVar11)) goto LAB_001ea1de;
                pGVar2 = pGVar3->pObjs;
                pGVar4 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar11) & 0xfffffffffffffffe);
                if ((pGVar4 < pGVar2) || (pGVar2 + (uint)pGVar3->nObjs <= pGVar4))
                goto LAB_001ea1fd;
                iVar12 = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2);
                if (iVar12 * -0x55555555 < 0) {
LAB_001ea279:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                pGVar1[lVar14].Value = ((uint)(pGVar2 + iVar11) & 1) + iVar12 * 0x55555556;
              }
              else {
                pGVar4 = Gia_ManAppendObj(pGVar3);
                uVar8 = *(ulong *)pGVar4;
                *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
                *(ulong *)pGVar4 =
                     uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = pGVar3->pObjs;
                if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
                Vec_IntPush(pGVar3->vCis,
                            (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
                pGVar2 = pGVar3->pObjs;
                if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
                pGVar1[lVar14].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556
                ;
                iVar10 = p1->nRegs;
                pVVar5 = p1->vCis;
              }
              lVar17 = lVar17 + 1;
              iVar12 = pVVar5->nSize;
              iVar9 = iVar12 - iVar10;
            } while (lVar17 < iVar9);
            iVar11 = p0->nRegs;
          }
          if (0 < iVar11) {
            iVar10 = 0;
            do {
              iVar12 = p0->vCis->nSize;
              uVar6 = (iVar12 - iVar11) + iVar10;
              if (((int)uVar6 < 0) || (iVar12 <= (int)uVar6)) goto LAB_001ea21c;
              iVar12 = p0->vCis->pArray[uVar6];
              if (((long)iVar12 < 0) || (p0->nObjs <= iVar12)) goto LAB_001ea1de;
              pGVar1 = p0->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar4 = Gia_ManAppendObj(pGVar3);
              uVar8 = *(ulong *)pGVar4;
              *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
              *(ulong *)pGVar4 =
                   uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              Vec_IntPush(pGVar3->vCis,
                          (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              pGVar1[iVar12].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
              iVar10 = iVar10 + 1;
              iVar11 = p0->nRegs;
            } while (iVar10 < iVar11);
            iVar10 = p1->nRegs;
          }
          if (0 < iVar10) {
            iVar11 = 0;
            do {
              iVar12 = p1->vCis->nSize;
              uVar6 = (iVar12 - iVar10) + iVar11;
              if (((int)uVar6 < 0) || (iVar12 <= (int)uVar6)) goto LAB_001ea21c;
              iVar10 = p1->vCis->pArray[uVar6];
              if (((long)iVar10 < 0) || (p1->nObjs <= iVar10)) goto LAB_001ea1de;
              pGVar1 = p1->pObjs;
              if (pGVar1 == (Gia_Obj_t *)0x0) break;
              pGVar4 = Gia_ManAppendObj(pGVar3);
              uVar8 = *(ulong *)pGVar4;
              *(ulong *)pGVar4 = uVar8 | 0x9fffffff;
              *(ulong *)pGVar4 =
                   uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) {
LAB_001ea1fd:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(pGVar3->vCis,
                          (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
              pGVar2 = pGVar3->pObjs;
              if ((pGVar4 < pGVar2) || (pGVar2 + pGVar3->nObjs <= pGVar4)) goto LAB_001ea1fd;
              pGVar1[iVar10].Value = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
              iVar11 = iVar11 + 1;
              iVar10 = p1->nRegs;
            } while (iVar11 < iVar10);
            iVar11 = p0->nRegs;
          }
          pVVar5 = p0->vCos;
          iVar10 = pVVar5->nSize;
          if (iVar11 < iVar10) {
            lVar17 = 0;
            do {
              if (iVar10 <= lVar17) goto LAB_001ea21c;
              iVar10 = pVVar5->pArray[lVar17];
              if (((long)iVar10 < 0) || (p0->nObjs <= iVar10)) goto LAB_001ea1de;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar10;
              Gia_ManMiter_rec(pGVar3,p0,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff));
              lVar14 = (long)p1->vCos->nSize;
              if (lVar14 - p1->nRegs <= lVar17) {
LAB_001ea25a:
                __assert_fail("v < Gia_ManPoNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
              }
              if (lVar14 <= lVar17) goto LAB_001ea21c;
              iVar11 = p1->vCos->pArray[lVar17];
              if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
              Gia_ManMiter_rec(pGVar3,p1,
                               p1->pObjs + iVar11 + -(*(ulong *)(p1->pObjs + iVar11) & 0x1fffffff));
              uVar8 = *(ulong *)pGVar1;
              uVar6 = pGVar1[-(uVar8 & 0x1fffffff)].Value;
              if (fDualOut == 0) {
                if (fImplic == 0) {
                  if ((int)uVar6 < 0) goto LAB_001ea23b;
                  lVar14 = (long)p1->vCos->nSize;
                  if (lVar14 - p1->nRegs <= lVar17) goto LAB_001ea25a;
                  if (lVar14 <= lVar17) goto LAB_001ea21c;
                  iVar11 = p1->vCos->pArray[lVar17];
                  if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                  uVar7 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                  uVar13 = (p1->pObjs + iVar11)[-(ulong)(uVar7 & 0x1fffffff)].Value;
                  if ((int)uVar13 < 0) goto LAB_001ea23b;
                  uVar6 = Gia_ManHashXor(pGVar3,(uint)uVar8 >> 0x1d & 1 ^ uVar6,
                                         uVar7 >> 0x1d & 1 ^ uVar13);
                }
                else {
                  if ((int)uVar6 < 0) goto LAB_001ea23b;
                  lVar14 = (long)p1->vCos->nSize;
                  if (lVar14 - p1->nRegs <= lVar17) goto LAB_001ea25a;
                  if (lVar14 <= lVar17) goto LAB_001ea21c;
                  iVar11 = p1->vCos->pArray[lVar17];
                  if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                  uVar7 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                  uVar13 = (p1->pObjs + iVar11)[-(ulong)(uVar7 & 0x1fffffff)].Value;
                  if ((int)uVar13 < 0) goto LAB_001ea23b;
                  uVar6 = Gia_ManHashAnd(pGVar3,(uint)uVar8 >> 0x1d & 1 ^ uVar6,
                                         uVar13 ^ uVar7 >> 0x1d & 1 ^ 1);
                }
              }
              else {
                if ((int)uVar6 < 0) goto LAB_001ea23b;
                Gia_ManAppendCo(pGVar3,(uint)(uVar8 >> 0x1d) & 1 ^ uVar6);
                lVar14 = (long)p1->vCos->nSize;
                if (lVar14 - p1->nRegs <= lVar17) goto LAB_001ea25a;
                if (lVar14 <= lVar17) goto LAB_001ea21c;
                iVar11 = p1->vCos->pArray[lVar17];
                if (((long)iVar11 < 0) || (p1->nObjs <= iVar11)) goto LAB_001ea1de;
                uVar13 = (uint)*(undefined8 *)(p1->pObjs + iVar11);
                uVar6 = (p1->pObjs + iVar11)[-(ulong)(uVar13 & 0x1fffffff)].Value;
                if ((int)uVar6 < 0) goto LAB_001ea23b;
                uVar6 = uVar13 >> 0x1d & 1 ^ uVar6;
              }
              Gia_ManAppendCo(pGVar3,uVar6);
              lVar17 = lVar17 + 1;
              iVar11 = p0->nRegs;
              pVVar5 = p0->vCos;
              iVar10 = pVVar5->nSize;
            } while (lVar17 < iVar10 - iVar11);
          }
          if (0 < iVar11) {
            iVar10 = 0;
            do {
              iVar12 = p0->vCos->nSize;
              uVar6 = (iVar12 - iVar11) + iVar10;
              if (((int)uVar6 < 0) || (iVar12 <= (int)uVar6)) goto LAB_001ea21c;
              iVar12 = p0->vCos->pArray[uVar6];
              if (((long)iVar12 < 0) || (p0->nObjs <= iVar12)) goto LAB_001ea1de;
              if (p0->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p0->pObjs + iVar12;
              Gia_ManMiter_rec(pGVar3,p0,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff));
              if ((int)pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value < 0) goto LAB_001ea23b;
              uVar6 = Gia_ManAppendCo(pGVar3,(uint)(*(ulong *)pGVar1 >> 0x1d) & 1 ^
                                             pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value);
              pGVar1->Value = uVar6;
              iVar10 = iVar10 + 1;
              iVar11 = p0->nRegs;
            } while (iVar10 < iVar11);
          }
          iVar10 = p1->nRegs;
          if (0 < iVar10) {
            iVar11 = 0;
            do {
              iVar12 = p1->vCos->nSize;
              uVar6 = (iVar12 - iVar10) + iVar11;
              if (((int)uVar6 < 0) || (iVar12 <= (int)uVar6)) {
LAB_001ea21c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar12 = p1->vCos->pArray[uVar6];
              if (((long)iVar12 < 0) || (p1->nObjs <= iVar12)) {
LAB_001ea1de:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p1->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar1 = p1->pObjs + iVar12;
              Gia_ManMiter_rec(pGVar3,p1,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff));
              if ((int)pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value < 0) {
LAB_001ea23b:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar6 = Gia_ManAppendCo(pGVar3,(uint)(*(ulong *)pGVar1 >> 0x1d) & 1 ^
                                             pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value);
              pGVar1->Value = uVar6;
              iVar11 = iVar11 + 1;
              iVar10 = p1->nRegs;
            } while (iVar11 < iVar10);
            iVar11 = p0->nRegs;
          }
          Gia_ManSetRegNum(pGVar3,iVar11 + iVar10);
        }
        Gia_ManHashStop(pGVar3);
        p = Gia_ManCleanup(pGVar3);
        Gia_ManStop(pGVar3);
        pGVar3 = Gia_ManDupNormalize(p,0);
        Gia_ManStop(p);
        return pGVar3;
      }
      pcVar16 = "Gia_ManMiter(): Designs have different number of COs.";
    }
    else {
      pcVar16 = "Gia_ManMiter(): Designs have different number of CIs.";
    }
  }
  else {
    iVar11 = p0->nRegs;
    iVar10 = p1->nRegs;
    if (p0->vCis->nSize - iVar11 == p1->vCis->nSize - iVar10) {
      if (p0->vCos->nSize - iVar11 == p1->vCos->nSize - iVar10) {
        if (iVar11 != 0 && iVar10 != 0) goto LAB_001e9272;
        pcVar16 = "Gia_ManMiter(): At least one of the designs has no registers.";
      }
      else {
        pcVar16 = "Gia_ManMiter(): Designs have different number of POs.";
      }
    }
    else {
      pcVar16 = "Gia_ManMiter(): Designs have different number of PIs.";
    }
  }
  puts(pcVar16);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManMiter( Gia_Man_t * p0, Gia_Man_t * p1, int nInsDup, int fDualOut, int fSeq, int fImplic, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit;
    if ( fSeq )
    {
        if ( Gia_ManPiNum(p0) != Gia_ManPiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of PIs.\n" );
            return NULL;
        }
        if ( Gia_ManPoNum(p0) != Gia_ManPoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of POs.\n" );
            return NULL;
        }
        if ( Gia_ManRegNum(p0) == 0 || Gia_ManRegNum(p1) == 0 )
        {
            printf( "Gia_ManMiter(): At least one of the designs has no registers.\n" );
            return NULL;
        }
    }
    else
    {
        if ( Gia_ManCiNum(p0) != Gia_ManCiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of CIs.\n" );
            return NULL;
        }
        if ( Gia_ManCoNum(p0) != Gia_ManCoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of COs.\n" );
            return NULL;
        }
    }
    // start the manager
    pNew = Gia_ManStart( Gia_ManObjNum(p0) + Gia_ManObjNum(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map combinational inputs
    Gia_ManFillValue( p0 );
    Gia_ManFillValue( p1 );
    Gia_ManConst0(p0)->Value = 0;
    Gia_ManConst0(p1)->Value = 0;
    // map internal nodes and outputs
    Gia_ManHashAlloc( pNew );
    if ( fSeq )
    {
        // create primary inputs
        Gia_ManForEachPi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPi( p1, pObj, i )
            if ( i < Gia_ManPiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManPi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create latch outputs
        Gia_ManForEachRo( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p1, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        // create primary outputs
        Gia_ManForEachPo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManPo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else 
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
        // create register inputs
        Gia_ManForEachRi( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManForEachRi( p1, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p0) + Gia_ManRegNum(p1) );
    }
    else
    {
        // create combinational inputs
        Gia_ManForEachCi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachCi( p1, pObj, i )
            if ( i < Gia_ManCiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManCi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create combinational outputs
        Gia_ManForEachCo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManCo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}